

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.h
# Opt level: O1

uint __thiscall CVmObjStringBuffer::calc_hash(CVmObjStringBuffer *this,vm_obj_id_t self,int param_2)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  
  piVar2 = (int *)(this->super_CVmObject).ext_;
  iVar1 = *piVar2;
  if (0 < iVar1) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + piVar2[lVar4 + 3];
      lVar4 = lVar4 + 1;
    } while (iVar1 != (int)lVar4);
    return uVar3;
  }
  return 0;
}

Assistant:

vm_strbuf_ext *get_ext() const { return (vm_strbuf_ext *)ext_; }